

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integer.c
# Opt level: O3

int64_t sysbvm_tuple_integer_decodeInt64(sysbvm_context_t *context,sysbvm_tuple_t value)

{
  ulong uVar1;
  ulong uVar2;
  
  if ((value & 0xf) != 0) {
    return (long)value >> 4;
  }
  if ((value != 0) && (3 < *(uint *)(value + 0xc))) {
    if (*(uint *)(value + 0xc) < 8) {
      uVar2 = (ulong)*(uint *)(value + 0x10);
    }
    else {
      uVar2 = *(ulong *)(value + 0x10);
    }
    uVar1 = -uVar2;
    if (*(sysbvm_tuple_t *)value != (context->roots).largeNegativeIntegerType) {
      uVar1 = uVar2;
    }
    return uVar1;
  }
  return 0;
}

Assistant:

int64_t sysbvm_tuple_integer_decodeInt64(sysbvm_context_t *context, sysbvm_tuple_t value)
{
    if(sysbvm_tuple_isImmediate(value))
        return sysbvm_tuple_integer_decodeSmall(value);

    size_t byteSize = sysbvm_tuple_getSizeInBytes(value);
    if(byteSize < 4)
        return 0;

    sysbvm_integer_t *integer = (sysbvm_integer_t *)value;
    int64_t decodedValue = 0;
    if(byteSize >= 8)
        decodedValue = (uint64_t)integer->words[0] | ((uint64_t)integer->words[1] << 32);
    else
        decodedValue = (uint64_t)integer->words[0];
    
    if(sysbvm_tuple_getType(context, value) == context->roots.largeNegativeIntegerType)
        decodedValue = -decodedValue;
    return decodedValue;
}